

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

NaReal __thiscall NaVector::median(NaVector *this)

{
  int iVar1;
  uint uVar2;
  long *in_RDI;
  NaReal NVar3;
  int N;
  NaVector rVect;
  NaVector *in_stack_ffffffffffffff98;
  uint i;
  NaVector *in_stack_ffffffffffffffa0;
  NaVector local_28;
  NaReal local_8;
  
  iVar1 = (**(code **)(*in_RDI + 0x30))();
  if (iVar1 == 0) {
    local_8 = 0.0;
  }
  else {
    NaVector(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    i = (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    uVar2 = dim(&local_28);
    sort(in_stack_ffffffffffffffa0);
    if ((int)uVar2 % 2 == 1) {
      local_8 = operator()(in_stack_ffffffffffffffa0,i);
    }
    else {
      in_stack_ffffffffffffffa0 = (NaVector *)operator()(in_stack_ffffffffffffffa0,i);
      NVar3 = operator()(in_stack_ffffffffffffffa0,i);
      local_8 = ((double)in_stack_ffffffffffffffa0 + NVar3) / 2.0;
    }
    ~NaVector(in_stack_ffffffffffffffa0);
  }
  return local_8;
}

Assistant:

NaReal
NaVector::median () const
{
  if(0 == dim())
    return 0.0;

  NaVector	rVect(*this);
  int		N = rVect.dim();

  rVect.sort();

  if(1 == N % 2){
    return rVect((N - 1) / 2);
  }else{
    return (rVect((N / 2) - 1) +
	    rVect((N / 2))) / 2;
  }
}